

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlUnloadFramebuffer(uint id)

{
  GLuint in_EDI;
  uint depthIdU;
  int depthId;
  int depthType;
  GLuint local_20;
  GLuint local_1c;
  GLuint local_18;
  GLint local_14;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = in_EDI;
  (*glad_glBindFramebuffer)(0x8d40,in_EDI);
  (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x8d00,0x8cd0,&local_14);
  (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x8d00,0x8cd1,(GLint *)&local_18);
  local_20 = local_18;
  if (local_14 == 0x8d41) {
    (*glad_glDeleteRenderbuffers)(1,&local_20);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glDeleteFramebuffers)(1,&local_1c);
  TraceLog(3,"FBO: [ID %i] Unloaded framebuffer from VRAM (GPU)",(ulong)local_1c);
  return;
}

Assistant:

void rlUnloadFramebuffer(unsigned int id)
{
#if (defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)) && defined(SUPPORT_RENDER_TEXTURES_HINT)

    // Query depth attachment to automatically delete texture/renderbuffer
    int depthType = 0, depthId = 0;
    glBindFramebuffer(GL_FRAMEBUFFER, id);   // Bind framebuffer to query depth texture type
    glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &depthType);
    glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, &depthId);

    unsigned int depthIdU = (unsigned int)depthId;
    if (depthType == GL_RENDERBUFFER) glDeleteRenderbuffers(1, &depthIdU);
    else if (depthType == GL_RENDERBUFFER) glDeleteTextures(1, &depthIdU);

    // NOTE: If a texture object is deleted while its image is attached to the *currently bound* framebuffer,
    // the texture image is automatically detached from the currently bound framebuffer.

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    glDeleteFramebuffers(1, &id);

    TRACELOG(LOG_INFO, "FBO: [ID %i] Unloaded framebuffer from VRAM (GPU)", id);
#endif
}